

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

int __thiscall mpt::layout::text::convert(text *this,type_t type,void *ptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  text *in_RAX;
  text *local_28;
  
  local_28 = in_RAX;
  iVar2 = type_properties<mpt::layout::text_*>::id(true);
  iVar3 = (int)type;
  if (iVar2 < 0) {
    iVar2 = 0x100;
  }
  else {
    local_28 = this;
    bVar1 = assign<mpt::layout::text*>(&local_28,iVar3,ptr);
    if (bVar1) {
      return iVar2;
    }
  }
  if (type == 0) {
    if (ptr == (void *)0x0) {
      return iVar2;
    }
    *(uint8_t **)ptr = convert::fmt;
    return iVar2;
  }
  if (ptr == (void *)0x0 || iVar3 != 0x100) {
    if (iVar3 == 0x100) goto LAB_00139753;
    if (iVar3 != 0x84 || ptr == (void *)0x0) {
      if (iVar3 != 0x84) {
        local_28 = (text *)&this->super_text;
        bVar1 = assign<mpt::text*>((text **)&local_28,iVar3,ptr);
        if (bVar1) {
          return 0x84;
        }
        bVar1 = assign<mpt::color>(&(this->super_text).color,iVar3,ptr);
        if (!bVar1) {
          return -3;
        }
        return iVar2;
      }
      goto LAB_00139753;
    }
    this = (text *)&this->super_object;
  }
  *(text **)ptr = this;
LAB_00139753:
  iVar3 = type_properties<mpt::text_*>::id(true);
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int layout::text::convert(type_t type, void *ptr)
{
	int me = type_properties<text *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int tx = type_properties<::mpt::text *>::id(true);
		return tx > 0 ? tx : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int tx = type_properties<::mpt::text *>::id(true);
		return tx > 0 ? tx : me;
	}
	if (assign(static_cast< ::mpt::text *>(this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(color, type, ptr)) {
		return me;
	}
	return MPT_ERROR(BadType);
}